

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_config.c
# Opt level: O0

int get_self_ip_iface(CMTransport_trace trace_func,void *trace_data,char *iface)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint32_t uVar5;
  char *pcVar6;
  size_t __n;
  char *pcVar7;
  char *in_RDX;
  undefined8 in_RSI;
  code *in_RDI;
  bool bVar8;
  char *c;
  char str_2 [16];
  char str_1 [16];
  in_addr *in_1;
  uint32_t ret_ip;
  int family_2;
  char str [16];
  in_addr *in;
  uint32_t IP;
  int family_1;
  int family;
  int rv;
  int ipv6_count;
  int ipv4_count;
  int ss;
  int ifrn;
  ifconf ifaces;
  sockaddr_in *sai;
  ifreq *ifr;
  char *ifreqs;
  char buf [46];
  void *tmp;
  ifaddrs *if_addr;
  ifaddrs *if_addrs;
  char **p;
  char hostname_buf [256];
  hostent *host;
  undefined8 in_stack_fffffffffffffd40;
  code *pcVar9;
  char local_208 [16];
  char local_1f8 [16];
  uint32_t *local_1e8;
  uint32_t local_1e0;
  uint local_1dc;
  char local_1d8 [16];
  uint32_t *local_1c8;
  uint32_t local_1c0;
  uint local_1bc;
  uint local_1b8;
  uint32_t local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_1a0 [2];
  void *local_198;
  long local_190;
  void *local_188;
  void *local_180;
  char local_178 [48];
  uint32_t *local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  char **local_130;
  char local_128 [256];
  hostent *local_28;
  char *local_20;
  undefined8 local_18;
  code *local_10;
  
  local_28 = (hostent *)0x0;
  local_138 = (undefined8 *)0x0;
  local_140 = (undefined8 *)0x0;
  local_148 = (uint32_t *)0x0;
  local_1ac = 0;
  local_1b0 = 0;
  local_1b4 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar4 = getifaddrs(&local_138);
  if (iVar4 == 0) {
    for (local_140 = local_138; pcVar9 = local_10, uVar2 = local_18, local_140 != (undefined8 *)0x0;
        local_140 = (undefined8 *)*local_140) {
      if ((local_140[3] != 0) &&
         ((local_1b8 = (uint)*(ushort *)local_140[3], local_1b8 == 2 || (local_1b8 == 10)))) {
        if (*(short *)local_140[3] == 2) {
          local_148 = (uint32_t *)(local_140[3] + 4);
          local_1ac = local_1ac + 1;
        }
        else {
          local_148 = (uint32_t *)(local_140[3] + 8);
          local_1b0 = local_1b0 + 1;
        }
        uVar1 = local_140[1];
        pcVar6 = inet_ntop(local_1b8,local_148,local_178,0x2e);
        (*pcVar9)(uVar2,"CM<IP_CONFIG> IP possibility -> %s : %s",uVar1,pcVar6);
        if ((local_1b8 == 2) && (get_self_ip_iface::first_call != 0)) {
          uVar2 = local_140[1];
          pcVar6 = inet_ntop(2,local_148,local_178,0x2e);
          dump_output(0x3ff,"\tADIOS2_IP_CONFIG Possible interface %s : IPV4 %s\n",uVar2,pcVar6);
        }
      }
    }
    if (local_20 == (char *)0x0) {
      local_20 = getenv("ADIOS2_INTERFACE");
    }
    if (local_20 != (char *)0x0) {
      (*local_10)(local_18,"CM<IP_CONFIG> searching for interface %s\n",local_20);
      if (get_self_ip_iface::first_call != 0) {
        dump_output(0x3ff,"\tADIOS2_IP_CONFIG interface %s requested\n",local_20);
      }
      for (local_140 = local_138; pcVar6 = local_20, local_140 != (undefined8 *)0x0;
          local_140 = (undefined8 *)*local_140) {
        if ((local_140[3] != 0) && (local_1bc = (uint)*(ushort *)local_140[3], local_1bc == 2)) {
          pcVar7 = (char *)local_140[1];
          __n = strlen(local_20);
          iVar4 = strncmp(pcVar7,pcVar6,__n);
          if (iVar4 == 0) {
            local_148 = (uint32_t *)(local_140[3] + 4);
            uVar2 = local_140[1];
            pcVar6 = inet_ntop(local_1bc,local_148,local_178,0x2e);
            (*local_10)(local_18,"CM<IP_CONFIG> Interface specified, returning ->%s : %s",uVar2,
                        pcVar6);
            pcVar6 = local_20;
            if (get_self_ip_iface::first_call != 0) {
              pcVar7 = inet_ntop(local_1bc,local_148,local_178,0x2e);
              dump_output(0x3ff,"\tADIOS2_IP_CONFIG interface %s found, using IP %s\n",pcVar6,pcVar7
                         );
            }
            local_1c0 = ntohl(*local_148);
            free(local_138);
            get_self_ip_iface::first_call = 0;
            return local_1c0;
          }
        }
      }
      printf("Warning!  ADIOS2_INTERFACE specified as \"%s\", but no active interface by that name found\n"
             ,local_20);
    }
    get_self_ip_iface::first_call = 0;
    gethostname(local_128,0x100);
    pcVar6 = index(local_128,0x2e);
    if (pcVar6 != (char *)0x0) {
      local_28 = gethostbyname(local_128);
    }
    if (local_28 != (hostent *)0x0) {
      for (local_130 = local_28->h_addr_list; *local_130 != (char *)0x0; local_130 = local_130 + 1)
      {
        local_1c8 = (uint32_t *)*local_130;
        ntohl(*local_1c8);
        iVar4 = ipv4_is_loopback((int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
        if (iVar4 == 0) {
          inet_ntop(2,local_1c8,local_1d8,0x10);
          (*local_10)(local_18,"CM<IP_CONFIG> Prefer IP associated with hostname net -> %s",
                      local_1d8);
          free(local_138);
          uVar5 = ntohl(*local_1c8);
          return uVar5;
        }
      }
    }
    for (local_140 = local_138; local_140 != (undefined8 *)0x0; local_140 = (undefined8 *)*local_140
        ) {
      if (((local_140[3] != 0) && (local_1dc = (uint)*(ushort *)local_140[3], local_1dc == 2)) &&
         ((*(uint *)(local_140 + 2) & 8) == 0)) {
        local_148 = (uint32_t *)(local_140[3] + 4);
        uVar2 = local_140[1];
        pcVar6 = inet_ntop(2,local_148,local_178,0x2e);
        (*local_10)(local_18,"CM<IP_CONFIG> get_self_ip_addr returning first avail -> %s : %s",uVar2
                    ,pcVar6);
        local_1e0 = ntohl(*local_148);
        free(local_138);
        return local_1e0;
      }
    }
  }
  gethostname(local_128,0x100);
  pcVar6 = strchr(local_128,0x2e);
  if (pcVar6 != (char *)0x0) {
    local_28 = gethostbyname(local_128);
  }
  if (local_28 != (hostent *)0x0) {
    for (local_130 = local_28->h_addr_list; *local_130 != (char *)0x0; local_130 = local_130 + 1) {
      local_1e8 = (uint32_t *)*local_130;
      ntohl(*local_1e8);
      iVar4 = ipv4_is_loopback((int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
      if (iVar4 == 0) {
        inet_ntop(2,local_1e8,local_1f8,0x10);
        uVar5 = ntohl(*local_1e8);
        (*local_10)(local_18,"CM<IP_CONFIG> - Get self IP addr %lx, net %s",uVar5,local_1f8);
        uVar5 = ntohl(*local_1e8);
        return uVar5;
      }
    }
  }
  local_1a8 = socket(2,2,0);
  local_1a0[0] = 0xa00;
  local_198 = malloc(0xa00);
  local_180 = local_198;
  iVar4 = ioctl(local_1a8,0x8912,local_1a0);
  if (-1 < iVar4) {
    local_188 = local_198;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)local_1a0[0];
    local_1a4 = SUB164(auVar3 / ZEXT816(0x28),0);
    while (iVar4 = local_1a4 + -1, bVar8 = local_1a4 != 0, local_1a4 = iVar4, bVar8) {
      ioctl(local_1a8,0x8913,local_188);
      pcVar9 = local_10;
      uVar2 = local_18;
      local_190 = (long)local_188 + 0x10;
      if ((*(ushort *)((long)local_188 + 0x10) & 8) == 0) {
        if ((*(ushort *)((long)local_188 + 0x10) & 1) == 0) {
          uVar5 = ntohl(*(uint32_t *)((long)local_188 + 0x14));
          (*pcVar9)(uVar2,"CM<IP_CONFIG> - Get self IP addr %lx, rejected, not UP",uVar5);
        }
        else if ((*(ushort *)((long)local_188 + 0x10) & 0x40) == 0) {
          uVar5 = ntohl(*(uint32_t *)((long)local_188 + 0x14));
          (*pcVar9)(uVar2,"CM<IP_CONFIG> - Get self IP addr %lx, rejected, not RUNNING",uVar5);
        }
        else if ((*(int *)((long)local_188 + 0x14) != 0) &&
                (*(int *)((long)local_188 + 0x14) != 0x7f000001)) {
          local_1b4 = ntohl(*(uint32_t *)((long)local_188 + 0x14));
          inet_ntop(2,(void *)(local_190 + 4),local_208,0x10);
          uVar2 = local_18;
          pcVar9 = local_10;
          uVar5 = ntohl(*(uint32_t *)(local_190 + 4));
          (*pcVar9)(uVar2,"CM<IP_CONFIG> - Get self IP addr DHCP %lx, net %s",uVar5,local_208);
          break;
        }
      }
      else {
        pcVar6 = inet_ntoa((in_addr)*(in_addr_t *)((long)local_188 + 0x14));
        (*pcVar9)(uVar2,"CM<IP_CONFIG> - Get self IP addr %s, rejected, loopback",pcVar6);
      }
      local_188 = (void *)((long)local_188 + 0x28);
    }
  }
  close(local_1a8);
  free(local_180);
  if (local_1b4 == 0) {
    pcVar6 = getenv("ADIOS2_LAST_RESORT_IP_ADDR");
    (*local_10)(local_18,"CM<IP_CONFIG> - Get self IP addr at last resort");
    if (pcVar6 != (char *)0x0) {
      (*local_10)(local_18,"CM<IP_CONFIG> - Translating last resort %s",pcVar6);
      local_1b4 = inet_addr(pcVar6);
    }
  }
  return local_1b4;
}

Assistant:

static int
get_self_ip_iface(CMTransport_trace trace_func, void* trace_data, char *iface)
{
    struct hostent *host = NULL;
    char hostname_buf[256];
    char **p;
#ifdef HAVE_GETIFADDRS
  struct ifaddrs *if_addrs = NULL;
  struct ifaddrs *if_addr = NULL;
  void *tmp = NULL;
  char buf[INET6_ADDRSTRLEN];
#endif
#ifdef SIOCGIFCONF
    char *ifreqs;
    struct ifreq *ifr;
    struct sockaddr_in *sai;
    struct ifconf ifaces;
    int ifrn;
    int ss;
    int ipv4_count = 0;
    int ipv6_count = 0;
    static int first_call = 1;
#endif
    int rv = 0;
#ifdef HAVE_GETIFADDRS
    if (getifaddrs(&if_addrs) == 0) {    
	// Print possible addresses
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if ((family != AF_INET) && (family != AF_INET6)) continue;
	    if (if_addr->ifa_addr->sa_family == AF_INET) {
	        tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		ipv4_count++;
	    } else {
	        tmp = &((struct sockaddr_in6 *)if_addr->ifa_addr)->sin6_addr;
		ipv6_count++;
	    }
	    trace_func(trace_data, "CM<IP_CONFIG> IP possibility -> %s : %s",
		       if_addr->ifa_name,
		       inet_ntop(family, tmp, buf, sizeof(buf)));
	    if ((family == AF_INET) && first_call) {
		dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG Possible interface %s : IPV4 %s\n",
			    if_addr->ifa_name,
			    inet_ntop(family, tmp, buf, sizeof(buf)));
	    } else {
		// until we support IPV6, don't dump info
		//dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG Possible interface %s : IPV6 %s\n",
		//	    if_addr->ifa_name,
		//	    inet_ntop(family, tmp, buf, sizeof(buf)));
	    }
	}
	if (!iface) iface = getenv(IPCONFIG_ENVVAR_PREFIX "INTERFACE");
	if (iface != NULL) {
	    trace_func(trace_data, "CM<IP_CONFIG> searching for interface %s\n", iface);
	    if (first_call) dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG interface %s requested\n", iface);
	    for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	        int family;
		uint32_t IP;
	        if (!if_addr->ifa_addr) continue;
		family = if_addr->ifa_addr->sa_family;
		if (family != AF_INET) continue;  /* currently not looking for ipv6 */
		if (strncmp(if_addr->ifa_name, iface, strlen(iface)) != 0) continue;
		tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		trace_func(trace_data, "CM<IP_CONFIG> Interface specified, returning ->%s : %s",
			   if_addr->ifa_name,
			   inet_ntop(family, tmp, buf, sizeof(buf)));
		if (first_call)
		dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG interface %s found, using IP %s\n", iface,
			   inet_ntop(family, tmp, buf, sizeof(buf)));
		IP = ntohl(*(uint32_t*)tmp);
		free(if_addrs);
		first_call = 0;
		return IP;
	    }
	    printf("Warning!  " IPCONFIG_ENVVAR_PREFIX "INTERFACE specified as \"%s\", but no active interface by that name found\n", iface);
	}
	    
	first_call = 0;
	gethostname(hostname_buf, sizeof(hostname_buf));
	if (index(hostname_buf, '.') != NULL) {
	    /* don't even check for host if not fully qualified */
	    host = gethostbyname(hostname_buf);
	}
	if (host != NULL) {
	    for (p = host->h_addr_list; *p != 0; p++) {
		struct in_addr *in = *(struct in_addr **) p;
		if (!ipv4_is_loopback(ntohl(in->s_addr))) {
		    char str[INET_ADDRSTRLEN];
					      
		    inet_ntop(AF_INET, &(in->s_addr), str, sizeof(str));
		    trace_func(trace_data, "CM<IP_CONFIG> Prefer IP associated with hostname net -> %s", str);
		    free(if_addrs);
		    return (ntohl(in->s_addr));
		}
	    }
	}
	/* choose the first thing that's not a loopback interface */
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    uint32_t ret_ip;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if (family != AF_INET) continue;  /* currently not looking for ipv6 */
	    if ((if_addr->ifa_flags & IFF_LOOPBACK) != 0)  continue;
	    tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
	    trace_func(trace_data, "CM<IP_CONFIG> get_self_ip_addr returning first avail -> %s : %s",
			       if_addr->ifa_name,
			       inet_ntop(family, tmp, buf, sizeof(buf)));
	    ret_ip = (ntohl(*(uint32_t*)tmp));
	    free(if_addrs);
	    return ret_ip;
	}
    }
#endif	
    gethostname(hostname_buf, sizeof(hostname_buf));
    if (strchr(hostname_buf, '.') != NULL) {
	/* don't even check for host if not fully qualified */
	host = gethostbyname(hostname_buf);
    }
    if (host != NULL) {
	for (p = host->h_addr_list; *p != 0; p++) {
	    struct in_addr *in = *(struct in_addr **) p;
	    if (!ipv4_is_loopback(ntohl(in->s_addr))) {
	        char str[INET_ADDRSTRLEN];
					      
		inet_ntop(AF_INET, &(in->s_addr), str, sizeof(str));
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %lx, net %s",
			   ntohl(in->s_addr), str);
		return (ntohl(in->s_addr));
	    }
	}
    }
    /*
     *  Since we couldn't find an IP address in some logical way, we'll open
     *  a DGRAM socket and ask it first for the list of its interfaces, and
     *  then checking for an interface we can use, and then finally asking that
     *  interface what its address is.
     */
#ifdef SIOCGIFCONF
    ss = socket(AF_INET, SOCK_DGRAM, 0);
    ifaces.ifc_len = 64 * sizeof(struct ifreq);
    ifaces.ifc_buf = ifreqs = malloc(ifaces.ifc_len);
    /*
     *  if we can't SIOCGIFCONF we're kind of dead anyway, bail.
     */
    if (ioctl(ss, SIOCGIFCONF, &ifaces) >= 0) {
	ifr = ifaces.ifc_req;
	ifrn = ifaces.ifc_len / sizeof(struct ifreq);
	for (; ifrn--; ifr++) {
	    char str[INET_ADDRSTRLEN];
	    /*
	     * Basically we'll take the first interface satisfying 
	     * the following: 
	     *   up, running, not loopback, address family is INET.
	     */
	    ioctl(ss, SIOCGIFFLAGS, ifr);
	    sai = (struct sockaddr_in *) &(ifr->ifr_addr);
	    if (ifr->ifr_flags & IFF_LOOPBACK) {
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %s, rejected, loopback",
			   inet_ntoa(sai->sin_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_UP)) {
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %lx, rejected, not UP",
			   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_RUNNING)) {
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %lx, rejected, not RUNNING",
			   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    /*
	     * sure would be nice to test for AF_INET here but it doesn't
	     * cooperate and I've done enough for now ...
	     * if (sai->sin_addr.s.addr != AF_INET) continue;
	    */
	    if (sai->sin_addr.s_addr == INADDR_ANY)
		continue;
	    if (sai->sin_addr.s_addr == INADDR_LOOPBACK)
		continue;
	    rv = ntohl(sai->sin_addr.s_addr);
					      
	    inet_ntop(AF_INET, &(sai->sin_addr.s_addr), str, sizeof(str));
	    trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr DHCP %lx, net %s",
		       ntohl(sai->sin_addr.s_addr), str);
	    break;
	}
    }
    close(ss);
    free(ifreqs);
#endif
    /*
     *  Absolute last resort.  If we can't figure out anything else, look
     *  for the CM_LAST_RESORT_IP_ADDR environment variable.
     */
    if (rv == 0) {
	char *c = getenv(IPCONFIG_ENVVAR_PREFIX "LAST_RESORT_IP_ADDR");
	trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr at last resort");
	if (c != NULL) {
	    trace_func(trace_data, "CM<IP_CONFIG> - Translating last resort %s", c);
	    rv = inet_addr(c);
	}
    }
    /*
     *	hopefully by now we've set rv to something useful.  If not,
     *  GET A BETTER NETWORK CONFIGURATION.
     */
    return rv;
}